

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dupstr.c
# Opt level: O0

char * dupstr(char *s)

{
  size_t sVar1;
  char *pcStack_18;
  int len;
  char *p;
  char *s_local;
  
  pcStack_18 = (char *)0x0;
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    pcStack_18 = (char *)safemalloc((long)((int)sVar1 + 1),1,0);
    strcpy(pcStack_18,s);
  }
  return pcStack_18;
}

Assistant:

char *dupstr(const char *s)
{
    char *p = NULL;
    if (s) {
        int len = strlen(s);
        p = snewn(len + 1, char);
        strcpy(p, s);
    }
    return p;
}